

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O2

void __thiscall Room::Room(Room *this,int roomNumber,int strength,bool audio,bool video)

{
  Model<Room>::Model(&this->super_Model<Room>);
  (this->super_Model<Room>)._vptr_Model = (_func_int **)&PTR_save_0012c070;
  *(int *)&(this->super_Model<Room>).field_0xc = roomNumber;
  this->strength = strength;
  this->audio = audio;
  this->video = video;
  return;
}

Assistant:

Room::Room(int roomNumber, int strength, bool audio, bool video) : roomNumber(roomNumber), strength(strength),
                                                                   audio(audio), video(video) {}